

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O3

char * __thiscall ExportDirWrapper::_getLibraryName(ExportDirWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool isOk;
  char local_19;
  
  local_19 = '\0';
  iVar2 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1c])
                    (this,4,0xffffffffffffffff,&local_19);
  if ((local_19 == '\x01') &&
     (uVar3 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1a])
                        (this,4,0xffffffffffffffff), uVar3 != 0)) {
    pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                      (pEVar1,CONCAT44(extraout_var,iVar2),(ulong)uVar3,1,0);
    return (char *)CONCAT44(extraout_var_00,iVar2);
  }
  return (char *)0x0;
}

Assistant:

char* ExportDirWrapper::_getLibraryName()
{
    bool isOk = false;
    offset_t offset = this->getNumValue(NAME_RVA, &isOk);
    if (!isOk) return NULL;

    Executable::addr_type aT = containsAddrType(NAME_RVA);
    if (aT == Executable::NOT_ADDR) return NULL;

    char *ptr = (char*) m_Exe->getContentAt(offset, aT, 1);
    if (!ptr) return NULL;

    return ptr;
}